

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanBGPlanner.cpp
# Opt level: O1

QFunctionsDiscrete * __thiscall
MonahanBGPlanner::BackupStageSlow
          (QFunctionsDiscrete *__return_storage_ptr__,MonahanBGPlanner *this,QFunctionsDiscrete *Qs)

{
  int iVar1;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  size_type sVar3;
  GaobetaVectorSet G;
  GaobetaVectorSet GStack_c8;
  
  pPVar2 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_pu;
  if (pPVar2 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar2 = (this->super_MonahanPlanner).super_AlphaVectorPlanning._m_puShared.px;
  }
  iVar1 = (**(code **)((long)*(pPVar2->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar1,(allocator_type *)&GStack_c8);
  BackProjectMonahanBG(&GStack_c8,this,Qs);
  if (iVar1 != 0) {
    sVar3 = 0;
    do {
      MonahanCrossSum(this,&GStack_c8,__return_storage_ptr__,(Index)sVar3,
                      (this->super_MonahanPlanner)._m_doIncPrune,0);
      sVar3 = sVar3 + 1;
    } while ((long)iVar1 != sVar3);
  }
  if (GStack_c8.base_ !=
      (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       **)0x0) {
    operator_delete(GStack_c8.base_,GStack_c8.allocated_elements_ << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
MonahanBGPlanner::BackupStageSlow(const QFunctionsDiscrete &Qs)
{
    int nrA=GetPU()->GetNrJointActions();
    QFunctionsDiscrete Qs1(nrA);

    GaobetaVectorSet G=BackProjectMonahanBG(Qs);

    // Do the cross-sums, results are stored in V1
    for(GaoVectorSetIndex a=0;a!=nrA;a++)
        MonahanCrossSum(G,Qs1,a,_m_doIncPrune);

    return(Qs1);
}